

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O0

Error __thiscall
asmjit::X86FuncArgsContext::markRegsForSwaps(X86FuncArgsContext *this,FuncFrameInfo *ffi)

{
  uint uVar1;
  uint *puVar2;
  long in_RSI;
  long in_RDI;
  uint32_t regMask;
  uint32_t regs;
  uint32_t workRegs;
  WorkData *wd;
  uint32_t i;
  char *in_stack_00000390;
  int in_stack_0000039c;
  char *in_stack_000003a0;
  uint local_48;
  uint local_34;
  uint local_4;
  
  if ((*(byte *)(in_RDI + 0x101) & 1) != 0) {
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      if ((local_34 != 0) &&
         (puVar2 = (uint *)(in_RDI + (ulong)local_34 * 0x40), *(char *)((long)puVar2 + 0x15) != '\0'
         )) {
        uVar1 = puVar2[1];
        local_48 = uVar1 & ((puVar2[2] | puVar2[4]) ^ 0xffffffff);
        if (local_48 == 0) {
          local_48 = uVar1 & (puVar2[2] ^ 0xffffffff);
        }
        if (local_48 == 0) {
          local_48 = *puVar2 & (uVar1 ^ 0xffffffff);
        }
        if (local_48 != 0) {
          if (local_48 == 0) {
            local_4 = 0xffffffff;
          }
          else {
            local_4 = 0;
            for (; (local_48 & 1) == 0; local_48 = local_48 >> 1 | 0x80000000) {
              local_4 = local_4 + 1;
            }
          }
          if (0x1f < local_4) {
            DebugUtils::assertionFailed(in_stack_000003a0,in_stack_0000039c,in_stack_00000390);
          }
          uVar1 = 1 << ((byte)local_4 & 0x1f);
          puVar2[1] = uVar1 | puVar2[1];
          if (3 < local_34) {
            DebugUtils::assertionFailed(in_stack_000003a0,in_stack_0000039c,in_stack_00000390);
          }
          *(uint *)(in_RSI + 4 + (ulong)local_34 * 4) =
               uVar1 | *(uint *)(in_RSI + 4 + (ulong)local_34 * 4);
        }
      }
    }
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86FuncArgsContext::markRegsForSwaps(FuncFrameInfo& ffi) noexcept {
  if (!_hasRegSwaps)
    return kErrorOk;

  // If some registers require swapping then select one dirty register that
  // can be used as a temporary. We can do it also without it (by using xors),
  // but using temporary is always safer and also faster approach.
  for (uint32_t i = 0; i < kMaxVRegKinds; i++) {
    // Skip all register kinds where swapping is natively supported (GP regs).
    if (i == X86Reg::kKindGp) continue;

    // Skip all register kinds that don't require swapping.
    WorkData& wd = _workData[i];
    if (!wd.numSwaps) continue;

    // Initially, pick some clobbered or dirty register.
    uint32_t workRegs = wd.workRegs;
    uint32_t regs = workRegs & ~(wd.usedRegs | wd.dstRegs);

    // If that didn't work out pick some register which is not in 'used'.
    if (!regs) regs = workRegs & ~wd.usedRegs;

    // If that didn't work out pick any other register that is allocable.
    // This last resort case will, however, result in marking one more
    // register dirty.
    if (!regs) regs = wd.archRegs & ~workRegs;

    // If that didn't work out we will have to use xors instead of moves.
    if (!regs) continue;

    uint32_t regMask = Utils::mask(Utils::findFirstBit(regs));
    wd.workRegs |= regMask;
    ffi.addDirtyRegs(i, regMask);
  }

  return kErrorOk;
}